

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandRecAdd3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *format;
  int fUseSOPB;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar2 = 0;
  do {
    fUseSOPB = iVar2;
    iVar1 = Extra_UtilGetopt(argc,argv,"gh");
    iVar2 = 1;
  } while (iVar1 == 0x67);
  if (iVar1 == -1) {
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      iVar2 = Abc_NtkRecIsRunning3();
      if (iVar2 != 0) {
        Abc_NtkRecAdd3(pNtk,fUseSOPB);
        return 0;
      }
      format = "This command works for AIGs after calling \"rec_start2\".\n";
    }
    else {
      format = "This command works for AIGs.\n";
    }
    iVar2 = 0;
    Abc_Print(-1,format);
  }
  else {
    Abc_Print(-2,"usage: rec_add3 [-h]\n");
    Abc_Print(-2,"\t        adds subgraphs from the current network to the set\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Abc_CommandRecAdd3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fUseSOPB = 0;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "gh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'g':
            fUseSOPB = 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works for AIGs.\n" );
        return 0;
    }
    if ( !Abc_NtkRecIsRunning3() )
    {
        Abc_Print( -1, "This command works for AIGs after calling \"rec_start2\".\n" );
        return 0;
    }
    Abc_NtkRecAdd3( pNtk, fUseSOPB );
    return 0;

usage:
    Abc_Print( -2, "usage: rec_add3 [-h]\n" );
    Abc_Print( -2, "\t        adds subgraphs from the current network to the set\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}